

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdnode.cc
# Opt level: O3

void __thiscall bdNode::addPeer(bdNode *this,bdId *id,uint32_t peerflags)

{
  bdFilter *this_00;
  long *plVar1;
  bool bVar2;
  int iVar3;
  uint32_t uVar4;
  ostream *poVar5;
  time_t tVar6;
  long *plVar7;
  bdPeer peer;
  sockaddr_in knownAddr;
  bdFriendEntry entry;
  bdPeer local_b8;
  sockaddr_in local_70;
  bdFriendEntry local_60;
  
  this_00 = &this->mFilterPeers;
  iVar3 = bdFilter::checkPeer(this_00,id,peerflags);
  if (iVar3 == 0) {
    bdFriendEntry::bdFriendEntry(&local_60);
    bVar2 = bdFriendList::findPeerEntry(&this->mFriendList,&id->id,&local_60);
    if (bVar2) {
      uVar4 = bdFriendEntry::getPeerFlags(&local_60);
      peerflags = uVar4 | peerflags;
      bVar2 = bdFriendEntry::addrKnown(&local_60,&local_70);
      if ((bVar2) && (local_70.sin_addr.s_addr != (id->addr).sin_addr.s_addr)) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"bdNode::addPeer(",0x10);
        (*this->mFns->_vptr_bdDhtFunctions[10])(this->mFns,&std::cerr,id);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,", ",2);
        *(uint *)(close + *(long *)(std::cerr + -0x18)) =
             *(uint *)(close + *(long *)(std::cerr + -0x18)) & 0xffffffb5 | 8;
        poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
        *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) =
             *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) & 0xffffffb5 | 2;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,") MASQUERADING AS KNOWN PEER - FLAGGING AS BAD",0x2e);
        std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'H');
        std::ostream::put('H');
        std::ostream::flush();
        bdPeerQueue::queuePeer(&this->mBadPeerQueue,id,peerflags);
        bdFilter::addPeerToFilter(this_00,&id->addr,peerflags);
        local_b8.mPeerId.id.data[0] = '\0';
        local_b8.mPeerId.id.data[1] = '\0';
        local_b8.mPeerId.id.data[2] = '\0';
        local_b8.mPeerId.id.data[3] = '\0';
        local_b8.mPeerId.id.data[4] = '\0';
        local_b8.mPeerId.id.data[5] = '\0';
        local_b8.mPeerId.id.data[6] = '\0';
        local_b8.mPeerId.id.data[7] = '\0';
        local_b8.mPeerId.addr._0_8_ = &local_b8;
        local_b8.mPeerId.addr.sin_zero = (uchar  [8])&local_b8;
        bdFilter::filteredIPs(this_00,(list<sockaddr_in,_std::allocator<sockaddr_in>_> *)&local_b8);
        bdStore::filterIpList
                  (&this->mStore,(list<sockaddr_in,_std::allocator<sockaddr_in>_> *)&local_b8);
        bdSpace::flagpeer(&this->mNodeSpace,id,0,4);
        plVar7 = (long *)local_b8.mPeerId.addr._0_8_;
        if ((bdPeer *)local_b8.mPeerId.addr._0_8_ == &local_b8) {
          return;
        }
        do {
          plVar1 = (long *)*plVar7;
          operator_delete(plVar7,0x20);
          plVar7 = plVar1;
        } while ((bdPeer *)plVar1 != &local_b8);
        return;
      }
    }
    bdQueryManager::addPeer(this->mQueryMgr,id,peerflags);
    bdSpace::add_peer(&this->mNodeSpace,id,peerflags);
    bdId::bdId(&local_b8.mPeerId);
    local_b8.mFoundTime._0_4_ = 0;
    local_b8._60_8_ = 0;
    local_b8.mLastSendTime = 0;
    local_b8.mLastRecvTime._0_4_ = 0;
    local_b8.mLastRecvTime._4_4_ = 0;
    local_b8.mPeerId.addr.sin_family = (id->addr).sin_family;
    local_b8.mPeerId.addr.sin_port = (id->addr).sin_port;
    local_b8.mPeerId.addr.sin_addr.s_addr = (id->addr).sin_addr.s_addr;
    local_b8.mPeerId.addr.sin_zero = *&(id->addr).sin_zero;
    local_b8.mPeerId.id.data._0_8_ = *(undefined8 *)(id->id).data;
    local_b8.mPeerId.id.data._8_8_ = *(undefined8 *)((id->id).data + 8);
    local_b8.mPeerId.id.data._16_4_ = *(undefined4 *)((id->id).data + 0x10);
    local_b8.mPeerFlags = peerflags;
    tVar6 = time((time_t *)0x0);
    local_b8.mLastRecvTime._0_4_ = (undefined4)tVar6;
    local_b8.mLastRecvTime._4_4_ = (undefined4)((ulong)tVar6 >> 0x20);
    bdStore::addStore(&this->mStore,&local_b8);
    bdConnectManager::updatePotentialConnectionProxy(this->mConnMgr,id,peerflags);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"bdNode::addPeer(",0x10);
    (*this->mFns->_vptr_bdDhtFunctions[10])(this->mFns,&std::cerr,id);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,", ",2);
    *(uint *)(close + *(long *)(std::cerr + -0x18)) =
         *(uint *)(close + *(long *)(std::cerr + -0x18)) & 0xffffffb5 | 8;
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
    *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) =
         *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) & 0xffffffb5 | 2;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,") FAILED the BAD PEER FILTER!!!! DISCARDING MSG",0x2f);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'H');
    std::ostream::put('H');
    std::ostream::flush();
    local_b8.mPeerId.id.data[0] = '\0';
    local_b8.mPeerId.id.data[1] = '\0';
    local_b8.mPeerId.id.data[2] = '\0';
    local_b8.mPeerId.id.data[3] = '\0';
    local_b8.mPeerId.id.data[4] = '\0';
    local_b8.mPeerId.id.data[5] = '\0';
    local_b8.mPeerId.id.data[6] = '\0';
    local_b8.mPeerId.id.data[7] = '\0';
    local_b8.mPeerId.addr._0_8_ = &local_b8;
    local_b8.mPeerId.addr.sin_zero = (uchar  [8])&local_b8;
    bdFilter::filteredIPs(this_00,(list<sockaddr_in,_std::allocator<sockaddr_in>_> *)&local_b8);
    bdStore::filterIpList
              (&this->mStore,(list<sockaddr_in,_std::allocator<sockaddr_in>_> *)&local_b8);
    bdPeerQueue::queuePeer(&this->mBadPeerQueue,id,peerflags);
    plVar7 = (long *)local_b8.mPeerId.addr._0_8_;
    if ((bdPeer *)local_b8.mPeerId.addr._0_8_ != &local_b8) {
      do {
        plVar1 = (long *)*plVar7;
        operator_delete(plVar7,0x20);
        plVar7 = plVar1;
      } while ((bdPeer *)plVar1 != &local_b8);
    }
  }
  return;
}

Assistant:

void bdNode::addPeer(const bdId *id, uint32_t peerflags) {

#ifdef DEBUG_NODE_ACTIONS 
	fprintf(stderr, "bdNode::addPeer(");
	mFns->bdPrintId(std::cerr, id);
	fprintf(stderr, ")\n");
#endif

	/* first check the filters */
    if (mFilterPeers.checkPeer(id, peerflags)) {
		std::cerr << "bdNode::addPeer(";
		mFns->bdPrintId(std::cerr, id);
		std::cerr << ", " << std::hex << peerflags << std::dec;
		std::cerr << ") FAILED the BAD PEER FILTER!!!! DISCARDING MSG";
		std::cerr << std::endl;

		std::list<struct sockaddr_in> filteredIPs;
        mFilterPeers.filteredIPs(filteredIPs);
		mStore.filterIpList(filteredIPs);

        mBadPeerQueue.queuePeer(id, peerflags);

		return;
	}

	/* next we check if it is a friend, whitelist etc, and adjust flags */
	bdFriendEntry entry;

	if (mFriendList.findPeerEntry(&(id->id), entry)) {
		/* found! */
		peerflags |= entry.getPeerFlags(); // translates internal into general ones.

		struct sockaddr_in knownAddr;
		if (entry.addrKnown(&knownAddr))
			if (knownAddr.sin_addr.s_addr != id->addr.sin_addr.s_addr) {
#ifndef DISABLE_BAD_PEER_FILTER	
				std::cerr << "bdNode::addPeer(";
				mFns->bdPrintId(std::cerr, id);
				std::cerr << ", " << std::hex << peerflags << std::dec;
				std::cerr << ") MASQUERADING AS KNOWN PEER - FLAGGING AS BAD";
				std::cerr << std::endl;
				
				// Stores in queue for later callback and desemination around the network.
                mBadPeerQueue.queuePeer(id, peerflags);

                mFilterPeers.addPeerToFilter(id->addr, peerflags);

				std::list<struct sockaddr_in> filteredIPs;
                mFilterPeers.filteredIPs(filteredIPs);
				mStore.filterIpList(filteredIPs);

				// DO WE EXPLICITLY NEED TO DO THIS, OR WILL THEY JUST BE DROPPED?
				//mNodeSpace.remove_badpeer(id);
				//mQueryMgr->remove_badpeer(id);
	
				// FLAG in NodeSpace (Should be dropped very quickly anyway)
				mNodeSpace.flagpeer(id, 0, BITDHT_PEER_EXFLAG_BADPEER);
				return;
#endif
			}
	}

	mQueryMgr->addPeer(id, peerflags);
	mNodeSpace.add_peer(id, peerflags);

	bdPeer peer;
	peer.mPeerId = *id;
	peer.mPeerFlags = peerflags;
	peer.mLastRecvTime = time(NULL);
	mStore.addStore(&peer);

	// Finally we pass to connections for them to use.
	mConnMgr->updatePotentialConnectionProxy(id, peerflags);


//#define DISPLAY_BITDHTNODES	1
#ifdef DISPLAY_BITDHTNODES
	/* TEMP to extract IDS for BloomFilter */
	if (peerflags & BITDHT_PEER_STATUS_DHT_ENGINE) {
		std::cerr << "bdNode::addPeer() FOUND BITDHT PEER";
		std::cerr << std::endl;
		mFns->bdPrintNodeId(std::cerr, &(id->id));
		std::cerr << std::endl;
	}
#endif
}